

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void orps_VW(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  _Bool _Var2;
  
  UVar1 = (pMyDisasm->Reserved_).VEX.state;
  if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    if (UVar1 != '\x01') {
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
      (pMyDisasm->Prefix).OperandSize = '\b';
      (pMyDisasm->Reserved_).MemDecoration = 0x70;
      (pMyDisasm->Instruction).Category = 0x40003;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"orpd",4);
LAB_0011a3ec:
      (pMyDisasm->Instruction).Mnemonic[4] = '\0';
      (pMyDisasm->Reserved_).Register_ = 4;
      GxEx(pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 3;
      return;
    }
    (pMyDisasm->Instruction).Mnemonic[4] = 'd';
    (pMyDisasm->Instruction).Mnemonic[5] = '\0';
  }
  else {
    if (UVar1 != '\x01') {
      _Var2 = prefixes_present(pMyDisasm);
      if (_Var2) {
        failDecode(pMyDisasm);
        return;
      }
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      (pMyDisasm->Instruction).Category = 0x40003;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"orps",4);
      goto LAB_0011a3ec;
    }
    (pMyDisasm->Instruction).Mnemonic[4] = 's';
    (pMyDisasm->Instruction).Mnemonic[5] = '\0';
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vorp",4);
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
  }
  if (((pMyDisasm->Reserved_).VEX.opcode == 0xc4) && ((pMyDisasm->Reserved_).REX.W_ == '\x01')) {
    (pMyDisasm->Reserved_).OperandSize = 0x40;
  }
  ArgsVEX(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ orps_VW(PDISASM pMyDisasm)
{
   /* ========== 0x66 */
   if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {

     if (GV.VEX.state == InUsePrefix) {
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vorpd");
       #endif
       if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
       if (GV.VEX.opcode == 0xc4) {
         /* using VEX3Bytes */
         if (GV.REX.W_ == 0x1) {
             GV.OperandSize = 64;
         }
       }
       ArgsVEX(pMyDisasm);
     }
     else {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       GV.MemDecoration = Arg2_m128d_xmm;
       pMyDisasm->Instruction.Category = SSE_INSTRUCTION+LOGICAL_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "orpd");
       #endif
       GV.Register_ = SSE_REG;
       GxEx(pMyDisasm);
       pMyDisasm->Operand1.AccessMode = READ + WRITE;
     }
   }
   else {
       if (GV.VEX.state == InUsePrefix) {
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vorps");
         #endif
         if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
         if (GV.VEX.opcode == 0xc4) {
           /* using VEX3Bytes */
           if (GV.REX.W_ == 0x1) {
               GV.OperandSize = 64;
           }
         }
         ArgsVEX(pMyDisasm);
       }
       else {
         if (prefixes_present(pMyDisasm)) { failDecode(pMyDisasm); return; }
         GV.MemDecoration = Arg2_m128_xmm;
         pMyDisasm->Instruction.Category = SSE_INSTRUCTION+LOGICAL_INSTRUCTION;
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "orps");
         #endif
         GV.Register_ = SSE_REG;
         GxEx(pMyDisasm);
         pMyDisasm->Operand1.AccessMode = READ + WRITE;

       }
   }
}